

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

bool Fixpp::impl::TagMatcher<Fixpp::Type::Int>::matchValue(Return *value,StreamCursor *cursor)

{
  StreamBuf<char> *pSVar1;
  long lVar2;
  size_t count;
  Return unaff_R12D;
  byte *pbVar3;
  bool bVar4;
  
  pSVar1 = cursor->buf;
  if (*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) {
    lVar2 = (**(code **)(*(long *)pSVar1 + 0x38))();
    if (lVar2 == 0) {
      bVar4 = false;
      goto LAB_008d9544;
    }
  }
  pSVar1 = cursor->buf;
  pbVar3 = *(byte **)&pSVar1->field_0x10;
  lVar2 = *(long *)&pSVar1->field_0x18 - (long)pbVar3;
  if (lVar2 == 0) {
    lVar2 = (**(code **)(*(long *)pSVar1 + 0x38))();
  }
  count = 0;
  unaff_R12D = 0;
  do {
    if ((byte)(*pbVar3 - 0x30) < 10) {
      unaff_R12D = (uint)*pbVar3 + unaff_R12D * 10 + -0x30;
      count = count + 1;
      lVar2 = lVar2 + -1;
      bVar4 = lVar2 != 0;
    }
    else {
      bVar4 = false;
    }
    pbVar3 = pbVar3 + 1;
  } while (bVar4);
  bVar4 = count != 0;
  if (bVar4) {
    StreamCursor::advance(cursor,count);
    bVar4 = true;
  }
LAB_008d9544:
  if (bVar4 != false) {
    *value = unaff_R12D;
  }
  return bVar4;
}

Assistant:

static bool matchValue(Return* value, StreamCursor& cursor)
            {
                int val;
                if (!match_int_fast(&val, cursor)) return false;

                *value = val;
                return true;
            }